

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCoordinatesTests.cpp
# Opt level: O1

TestCaseGroup * vkt::tessellation::createCoordinatesTests(TestContext *testCtx)

{
  bool bVar1;
  TestNode *node;
  size_t sVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  undefined1 auStack_1e8 [8];
  TestNode *local_1e0;
  _func_int **local_1d8;
  TestContext *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  char *local_1a8;
  undefined8 local_1a0;
  char local_198;
  undefined7 uStack_197;
  ios_base local_138 [264];
  
  local_1e0 = (TestNode *)operator_new(0x70);
  local_1d0 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1e0,testCtx,"tesscoord","Tessellation coordinates tests");
  iVar3 = 0;
  local_1d8 = (_func_int **)&PTR__TestCase_00d1aed0;
  do {
    iVar5 = 0;
    do {
      node = (TestNode *)operator_new(0x78);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      if (iVar3 == 0) {
        bVar1 = false;
        pcVar4 = "triangles";
      }
      else if (iVar3 == 2) {
        bVar1 = false;
        pcVar4 = "isolines";
      }
      else if (iVar3 == 1) {
        bVar1 = false;
        pcVar4 = "quads";
      }
      else {
        bVar1 = true;
        pcVar4 = (char *)0x0;
      }
      if (bVar1) {
        std::ios::clear((int)auStack_1e8 + (int)*(undefined8 *)(local_1a8 + -0x18) + 0x40);
      }
      else {
        sVar2 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar4,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"_",1);
      if (iVar5 == 0) {
        bVar1 = false;
        pcVar4 = "equal_spacing";
      }
      else if (iVar5 == 2) {
        bVar1 = false;
        pcVar4 = "fractional_even_spacing";
      }
      else if (iVar5 == 1) {
        bVar1 = false;
        pcVar4 = "fractional_odd_spacing";
      }
      else {
        bVar1 = true;
        pcVar4 = (char *)0x0;
      }
      if (bVar1) {
        std::ios::clear((int)auStack_1e8 + (int)*(undefined8 *)(local_1a8 + -0x18) + 0x40);
      }
      else {
        sVar2 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar4,sVar2);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      local_1a0 = 0;
      local_198 = '\0';
      local_1a8 = &local_198;
      tcu::TestCase::TestCase((TestCase *)node,local_1d0,(char *)local_1c8,&local_198);
      node->_vptr_TestNode = local_1d8;
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
      }
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d2e860;
      *(int *)&node[1]._vptr_TestNode = iVar3;
      *(int *)((long)&node[1]._vptr_TestNode + 4) = iVar5;
      tcu::TestNode::addChild(local_1e0,node);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 3);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  return (TestCaseGroup *)local_1e0;
}

Assistant:

tcu::TestCaseGroup* createCoordinatesTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "tesscoord", "Tessellation coordinates tests"));

	for (int primitiveTypeNdx = 0; primitiveTypeNdx < TESSPRIMITIVETYPE_LAST; ++primitiveTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
		group->addChild(new TessCoordTest(testCtx, (TessPrimitiveType)primitiveTypeNdx, (SpacingMode)spacingModeNdx));

	return group.release();
}